

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfFast.c
# Opt level: O2

int Cnf_CutCountClauses(Aig_Man_t *p,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Int_t *vCover)

{
  int iVar1;
  void *pvVar2;
  int iVar3;
  int *piVar4;
  word Truth;
  
  piVar4 = &vLeaves->nSize;
  if (vLeaves->nSize < 7) {
    Truth = Cnf_CutDeriveTruth(p,vLeaves,vNodes);
    iVar1 = Kit_TruthIsop((uint *)&Truth,vLeaves->nSize,vCover,0);
    if (iVar1 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0x1da,
                    "int Cnf_CutCountClauses(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
    }
    iVar1 = vCover->nSize;
    Truth = ~Truth;
    iVar3 = Kit_TruthIsop((uint *)&Truth,*piVar4,vCover,0);
    if (iVar3 < 0) {
      __assert_fail("RetValue >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfFast.c"
                    ,0x1e0,
                    "int Cnf_CutCountClauses(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)");
    }
    piVar4 = &vCover->nSize;
  }
  else {
    iVar1 = 1;
    for (iVar3 = 0; iVar3 < vNodes->nSize; iVar3 = iVar3 + 1) {
      pvVar2 = Vec_PtrEntry(vNodes,iVar3);
      if (((*(ulong *)((long)pvVar2 + 8) & 1) != 0) &&
         ((*(byte *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x18) & 0x10) == 0)) {
        puts("Unusual 1!");
      }
      if (((*(ulong *)((long)pvVar2 + 0x10) & 1) != 0) &&
         ((*(byte *)((*(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe) + 0x18) & 0x10) == 0)) {
        puts("Unusual 2!");
      }
    }
  }
  return iVar1 + *piVar4;
}

Assistant:

int Cnf_CutCountClauses( Aig_Man_t * p, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Int_t * vCover )
{
    word Truth;
    Aig_Obj_t * pObj;
    int i, RetValue, nSize = 0;
    if ( Vec_PtrSize(vLeaves) > 6 )
    {
        // make sure this is an AND gate
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        {
            if ( Aig_ObjFaninC0(pObj) && !Aig_ObjFanin0(pObj)->fMarkA )
                printf( "Unusual 1!\n" );
            if ( Aig_ObjFaninC1(pObj) && !Aig_ObjFanin1(pObj)->fMarkA )
                printf( "Unusual 2!\n" );
            continue;

            assert( !Aig_ObjFaninC0(pObj) || Aig_ObjFanin0(pObj)->fMarkA );
            assert( !Aig_ObjFaninC1(pObj) || Aig_ObjFanin1(pObj)->fMarkA );
        }
        return Vec_PtrSize(vLeaves) + 1;
    }
    Truth = Cnf_CutDeriveTruth( p, vLeaves, vNodes );

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    nSize += Vec_IntSize(vCover);

    Truth = ~Truth;

    RetValue = Kit_TruthIsop( (unsigned *)&Truth, Vec_PtrSize(vLeaves), vCover, 0 );
    assert( RetValue >= 0 );
    nSize += Vec_IntSize(vCover);
    return nSize;
}